

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerializer.cpp
# Opt level: O0

ISerializedValue * __thiscall
SimpleSerializer::GetISerializedValue(SimpleSerializer *this,char *propertyName)

{
  ISerializedValue *__s;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  iterator local_88;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>
  local_80 [3];
  allocator<char> local_61;
  key_type local_60;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>
  local_38;
  const_iterator propertyFound;
  _Rb_tree_const_iterator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>
  local_28;
  ISerializedValue *local_20;
  ISerializedValue *pRet;
  char *propertyName_local;
  SimpleSerializer *this_local;
  
  pRet = (ISerializedValue *)propertyName;
  propertyName_local = (char *)this;
  if (this->m_pCurrentObject == (IObject *)0x0) {
    __assert_fail("m_pCurrentObject",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/SimpleSerializer/SimpleSerializer.cpp"
                  ,0x72,
                  "virtual const ISerializedValue *SimpleSerializer::GetISerializedValue(const char *) const"
                 );
  }
  if (propertyName == (char *)0x0) {
    __assert_fail("propertyName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/SimpleSerializer/SimpleSerializer.cpp"
                  ,0x73,
                  "virtual const ISerializedValue *SimpleSerializer::GetISerializedValue(const char *) const"
                 );
  }
  if ((this->m_bLoading & 1U) == 0) {
    __assert_fail("m_bLoading",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/SimpleSerializer/SimpleSerializer.cpp"
                  ,0x74,
                  "virtual const ISerializedValue *SimpleSerializer::GetISerializedValue(const char *) const"
                 );
  }
  local_20 = (ISerializedValue *)0x0;
  std::
  _Rb_tree_const_iterator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>
  ::_Rb_tree_const_iterator(&local_28,&this->m_CurrentSerialization);
  propertyFound._M_node =
       (_Base_ptr)
       std::
       map<ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>,_std::less<ObjectId>,_std::allocator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>_>
       ::end(&this->m_map);
  bVar1 = std::operator!=(&local_28,(_Self *)&propertyFound);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>
             ::operator->(&this->m_CurrentSerialization);
    __s = pRet;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,(char *)__s,&local_61);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>
         ::find(&ppVar2->second,&local_60);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>
    ::_Rb_tree_const_iterator(&local_38,&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>
             ::operator->(&this->m_CurrentSerialization);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>
         ::end(&ppVar2->second);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>
    ::_Rb_tree_const_iterator(local_80,&local_88);
    bVar1 = std::operator!=(&local_38,local_80);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>
               ::operator->(&local_38);
      local_20 = ppVar3->second;
    }
  }
  return local_20;
}

Assistant:

const ISerializedValue* SimpleSerializer::GetISerializedValue(const char* propertyName) const
{
	assert( m_pCurrentObject );
	assert( propertyName );
	assert( m_bLoading );
	const ISerializedValue* pRet = NULL;

	//TSerializationMap::const_iterator found = m_map.find(ownerId);
	if (m_CurrentSerialization != m_map.end())
	{
		TValueGroup::const_iterator propertyFound = m_CurrentSerialization->second.find(propertyName);
		if (propertyFound != m_CurrentSerialization->second.end())
		{
			pRet = propertyFound->second;
		}
	}

	return pRet;
}